

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
                 *)0x178bf3a);
  vVar2 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
          ::val((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                 *)0x178bf4d);
  return vVar1 * vVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}